

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O0

int rs1LinProjection(Vector3d *X,Vector2d *u,Vector3d *v,Vector3d *C,Vector3d *w,Vector3d *t,
                    double f,double rd,double r0,int direction)

{
  Scalar *pSVar1;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RSI;
  double rc2;
  Vector3d temp;
  int niter;
  double diff;
  double n;
  Matrix3d Rv;
  Matrix3d K;
  Vector3d uh;
  Matrix<double,_3,_4,_0,_3,_4> P;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffff7f8;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *in_stack_fffffffffffff800;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff808;
  int iVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff810;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff818;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff820;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff828;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
  *in_stack_fffffffffffff830;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff840;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  double *scalar;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *this_00;
  Vector3d *in_stack_fffffffffffff8d8;
  AngleAxis<double> *in_stack_fffffffffffff998;
  int local_3fc;
  double local_3f8;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_268 [56];
  undefined8 local_230;
  RealScalar local_1c0;
  undefined8 local_170;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_158 [48];
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_128 [16];
  double local_118 [32];
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_18;
  
  local_18 = in_RSI;
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x5b5e76);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x5b5e83);
  this = local_128;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  scalar = local_118;
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff800,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff7f8);
  this_00 = local_158;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::diagonal
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff808);
  Eigen::DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>::operator<<
            ((DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_> *)
             in_stack_fffffffffffff808,(Scalar *)in_stack_fffffffffffff800);
  Eigen::CommaInitializer<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>::operator_
            ((CommaInitializer<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_> *)
             in_stack_fffffffffffff810,(Scalar *)in_stack_fffffffffffff808);
  local_170 = 0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>::operator_
            ((CommaInitializer<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_> *)
             in_stack_fffffffffffff810,(Scalar *)in_stack_fffffffffffff808);
  Eigen::CommaInitializer<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>::
  ~CommaInitializer((CommaInitializer<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_> *)
                    0x5b5f30);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x5b5f3d);
  local_1c0 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffff7f8);
  if (1e-15 <= local_1c0) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (this,(double *)in_stack_fffffffffffff840);
    Eigen::AngleAxis<double>::
    AngleAxis<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((AngleAxis<double> *)in_stack_fffffffffffff810,(Scalar *)in_stack_fffffffffffff808,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff800);
    iVar2 = (int)((ulong)in_stack_fffffffffffff808 >> 0x20);
    Eigen::AngleAxis<double>::toRotationMatrix(in_stack_fffffffffffff998);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff800,
               (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff7f8);
  }
  else {
    local_230 = 0;
    in_stack_fffffffffffff830 = local_268;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x5b5f88);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (in_stack_fffffffffffff808,(Scalar *)in_stack_fffffffffffff800);
    in_stack_fffffffffffff840 =
         Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   (in_stack_fffffffffffff810,(Scalar *)in_stack_fffffffffffff808);
    in_stack_fffffffffffff828 =
         Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   (in_stack_fffffffffffff810,(Scalar *)in_stack_fffffffffffff808);
    in_stack_fffffffffffff820 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
                   (in_stack_fffffffffffff828);
    Eigen::AngleAxis<double>::AngleAxis<Eigen::Matrix<double,3,1,0,3,1>>
              ((AngleAxis<double> *)in_stack_fffffffffffff810,(Scalar *)in_stack_fffffffffffff808,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff800);
    iVar2 = (int)((ulong)in_stack_fffffffffffff808 >> 0x20);
    Eigen::AngleAxis<double>::toRotationMatrix(in_stack_fffffffffffff998);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff800,
               (Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff7f8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x5b6069);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff800,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff7f8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
  operator+((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
             *)in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_fffffffffffff818,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff810);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff800,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
              *)in_stack_fffffffffffff7f8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::head<int>
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff810,iVar2);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff800,
             (Index)in_stack_fffffffffffff7f8);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,1,false>>::operator/
            (this_00,scalar);
  Eigen::Matrix<double,2,1,0,2,1>::operator=
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  local_3f8 = 1e+15;
  local_3fc = 0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x5b6214);
  while( true ) {
    if (local_3f8 <= 1e-10) {
      return 0;
    }
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                       (in_stack_fffffffffffff800,(Index)in_stack_fffffffffffff7f8);
    iVar2 = (int)((ulong)*pSVar1 >> 0x20);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                       (in_stack_fffffffffffff800,(Index)in_stack_fffffffffffff7f8);
    other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)*pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                       (in_stack_fffffffffffff800,(Index)in_stack_fffffffffffff7f8);
    in_stack_fffffffffffff800 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)*pSVar1;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
              (in_stack_fffffffffffff800,(Index)in_stack_fffffffffffff7f8);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
              (in_stack_fffffffffffff800,(Index)in_stack_fffffffffffff7f8);
    Eigen::operator*((double *)this,(StorageBaseType *)in_stack_fffffffffffff840);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff800,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff7f8);
    X_(in_stack_fffffffffffff8d8);
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
    ::operator+((MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_fffffffffffff828,
                (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff820);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_fffffffffffff818,other);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                 *)in_stack_fffffffffffff818,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
    ::operator+((MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                 *)in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
              (in_stack_fffffffffffff800,(Index)in_stack_fffffffffffff7f8);
    Eigen::operator*((double *)this,(StorageBaseType *)in_stack_fffffffffffff840);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffff828,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffff820);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              (in_stack_fffffffffffff818,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)other);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff800,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_0>_>
                *)in_stack_fffffffffffff7f8);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff800
               ,(Index)in_stack_fffffffffffff7f8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (this,(double *)in_stack_fffffffffffff840);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff800,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff7f8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::head<int>
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other,iVar2);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_1,_false>_>::operator*=
              (in_stack_fffffffffffff830,(Scalar *)in_stack_fffffffffffff828);
    in_stack_fffffffffffff818 = local_18;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::head<int>
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other,iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)in_stack_fffffffffffff828,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *)
               in_stack_fffffffffffff820);
    local_3f8 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_1,_false>_>_>
                ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>_>
                        *)in_stack_fffffffffffff7f8);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::head<int>
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other,iVar2);
    Eigen::Matrix<double,2,1,0,2,1>::operator=
              ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff800,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> *)
               in_stack_fffffffffffff7f8);
    if (100 < local_3fc) break;
    local_3fc = local_3fc + 1;
  }
  return 2;
}

Assistant:

int rs1LinProjection(const Eigen::Vector3d &X, Eigen::Vector2d &u, const Eigen::Vector3d &v, const Eigen::Vector3d &C, const Eigen::Vector3d &w, const Eigen::Vector3d &t, double f, double rd, double r0, int direction){
    Eigen::Matrix<double,3,4> P;
    Eigen::Vector3d uh;
    Eigen::Matrix3d K = Eigen::Matrix3d::Zero();
    K.diagonal() << f, f, 1;
    // Eigen::Matrix3d Rv = Eigen::Matrix3d::Identity() + X_(v); 
    Eigen::Matrix3d Rv;
    double n = v.norm();
    if(n < 1e-15){
        Rv = Eigen::AngleAxis<double>(0, (Eigen::Vector3d() << 1,0,0).finished()).toRotationMatrix();
    }else{
        Rv = Eigen::AngleAxis<double>(n, v/n).toRotationMatrix();
    }

    uh = K* ( Rv * X + C );
    u = uh.head(2)/uh(2);

    double diff = 1e15;

    int niter = 0;
    
    Eigen::Vector3d temp;

    while(diff > 1e-10 ){
        double rc2 = u(0)*u(0) + u(1)*u(1);
        temp = K * ((Eigen::Matrix3d::Identity() + X_(u(direction) * w)) * Rv * X + C + u(direction) * t);
        temp = temp/temp(2);
        temp.head(2) *= (1 + rd * rc2);
        diff = (u - temp.head(2)).norm();
        u = temp.head(2);
        if(niter > 100){
            return WARN_NO_CONVERGENCE;
        }
        niter++;
    }


    return 0;

}